

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::CuePoint::Write(CuePoint *this,IMkvWriter *writer)

{
  bool bVar1;
  uint64 uVar2;
  uint64 uVar3;
  IMkvWriter *writer_00;
  long lVar4;
  long *in_RSI;
  uint64 in_RDI;
  int64_t stop_position;
  int64_t payload_position;
  uint64_t payload_size;
  uint64_t track_pos_size;
  uint64_t size;
  IMkvWriter *in_stack_ffffffffffffffc0;
  IMkvWriter *in_stack_ffffffffffffffc8;
  long local_20;
  bool local_1;
  
  if (((in_RSI == (long *)0x0) || (*(long *)(in_RDI + 8) == 0)) || (*(long *)(in_RDI + 0x10) == 0))
  {
    local_1 = false;
  }
  else {
    uVar2 = EbmlElementSize((uint64)in_stack_ffffffffffffffc0,in_RDI);
    uVar3 = EbmlElementSize((uint64)in_stack_ffffffffffffffc0,in_RDI);
    local_20 = uVar3 + uVar2;
    if (((*(byte *)(in_RDI + 0x20) & 1) != 0) && (1 < *(ulong *)(in_RDI + 0x18))) {
      uVar2 = EbmlElementSize((uint64)in_stack_ffffffffffffffc0,in_RDI);
      local_20 = uVar2 + local_20;
    }
    uVar2 = EbmlMasterElementSize((uint64)in_stack_ffffffffffffffc0,in_RDI);
    uVar3 = EbmlElementSize((uint64)in_stack_ffffffffffffffc0,in_RDI);
    bVar1 = WriteEbmlMasterElement
                      (in_stack_ffffffffffffffc8,(uint64)in_stack_ffffffffffffffc0,in_RDI);
    if (bVar1) {
      writer_00 = (IMkvWriter *)(**(code **)(*in_RSI + 8))();
      if ((long)writer_00 < 0) {
        local_1 = false;
      }
      else {
        bVar1 = WriteEbmlElement(in_stack_ffffffffffffffc0,in_RDI,0x15f19a);
        if (bVar1) {
          bVar1 = WriteEbmlMasterElement(writer_00,(uint64)in_stack_ffffffffffffffc0,in_RDI);
          if (bVar1) {
            bVar1 = WriteEbmlElement(in_stack_ffffffffffffffc0,in_RDI,0x15f1e1);
            if (bVar1) {
              bVar1 = WriteEbmlElement(in_stack_ffffffffffffffc0,in_RDI,0x15f206);
              if (bVar1) {
                if ((((*(byte *)(in_RDI + 0x20) & 1) == 0) || (*(ulong *)(in_RDI + 0x18) < 2)) ||
                   (bVar1 = WriteEbmlElement(in_stack_ffffffffffffffc0,in_RDI,0x15f23d), bVar1)) {
                  lVar4 = (**(code **)(*in_RSI + 8))();
                  if (lVar4 < 0) {
                    local_1 = false;
                  }
                  else if (lVar4 - (long)writer_00 == uVar3 + uVar2 + local_20) {
                    local_1 = true;
                  }
                  else {
                    local_1 = false;
                  }
                }
                else {
                  local_1 = false;
                }
              }
              else {
                local_1 = false;
              }
            }
            else {
              local_1 = false;
            }
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool CuePoint::Write(IMkvWriter* writer) const {
  if (!writer || track_ < 1 || cluster_pos_ < 1)
    return false;

  uint64_t size = EbmlElementSize(libwebm::kMkvCueClusterPosition,
                                  static_cast<uint64>(cluster_pos_));
  size += EbmlElementSize(libwebm::kMkvCueTrack, static_cast<uint64>(track_));
  if (output_block_number_ && block_number_ > 1)
    size += EbmlElementSize(libwebm::kMkvCueBlockNumber,
                            static_cast<uint64>(block_number_));
  const uint64_t track_pos_size =
      EbmlMasterElementSize(libwebm::kMkvCueTrackPositions, size) + size;
  const uint64_t payload_size =
      EbmlElementSize(libwebm::kMkvCueTime, static_cast<uint64>(time_)) +
      track_pos_size;

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvCuePoint, payload_size))
    return false;

  const int64_t payload_position = writer->Position();
  if (payload_position < 0)
    return false;

  if (!WriteEbmlElement(writer, libwebm::kMkvCueTime,
                        static_cast<uint64>(time_))) {
    return false;
  }

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvCueTrackPositions, size))
    return false;
  if (!WriteEbmlElement(writer, libwebm::kMkvCueTrack,
                        static_cast<uint64>(track_))) {
    return false;
  }
  if (!WriteEbmlElement(writer, libwebm::kMkvCueClusterPosition,
                        static_cast<uint64>(cluster_pos_))) {
    return false;
  }
  if (output_block_number_ && block_number_ > 1) {
    if (!WriteEbmlElement(writer, libwebm::kMkvCueBlockNumber,
                          static_cast<uint64>(block_number_))) {
      return false;
    }
  }

  const int64_t stop_position = writer->Position();
  if (stop_position < 0)
    return false;

  if (stop_position - payload_position != static_cast<int64_t>(payload_size))
    return false;

  return true;
}